

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,FTextureID *value,FTextureID *defval)

{
  bool bVar1;
  int iVar2;
  FTextureID FVar3;
  int iVar4;
  FTexture *pFVar5;
  FTexture *pFVar6;
  Value *this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  Ch *cc;
  char *name_00;
  bool local_71;
  Value *typeval;
  Value *nameval;
  Value *val;
  char *name;
  FTexture *pic;
  FTextureID *pFStack_30;
  FTextureID chk;
  FTextureID *defval_local;
  FTextureID *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  pFStack_30 = defval;
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (pFStack_30 == (FTextureID *)0x0)) ||
       (bVar1 = FTextureID::operator!=(value,pFStack_30), bVar1)) {
      bVar1 = FTextureID::Exists(value);
      if (bVar1) {
        bVar1 = FTextureID::isNull(value);
        if (bVar1) {
          FSerializer::WriteKey(arc,key);
          FWriter::Int(arc->w,0);
        }
        else {
          pic._4_4_ = (FTextureID)value->texnum;
          iVar4 = FTextureID::GetIndex((FTextureID *)((long)&pic + 4));
          iVar2 = FTextureManager::NumTextures(&TexMan);
          if (iVar2 <= iVar4) {
            FTextureID::SetNull((FTextureID *)((long)&pic + 4));
          }
          pFVar5 = FTextureManager::operator[](&TexMan,pic._4_4_);
          pFVar6 = FWadCollection::GetLinkedTexture(&Wads,pFVar5->SourceLump);
          if (pFVar6 == pFVar5) {
            val = (Value *)FWadCollection::GetLumpFullName(&Wads,pFVar5->SourceLump);
          }
          else {
            val = (Value *)FString::operator_cast_to_char_(&pFVar5->Name);
          }
          FSerializer::WriteKey(arc,key);
          FWriter::StartArray(arc->w);
          FWriter::String(arc->w,(char *)val);
          FWriter::Int(arc->w,(uint)pFVar5->UseType);
          FWriter::EndArray(arc->w);
        }
      }
      else {
        FSerializer::WriteKey(arc,key);
        FWriter::Null(arc->w);
      }
    }
  }
  else {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsArray(this);
      if (bVar1) {
        this_00 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,0);
        this_01 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,1);
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsString(this_00);
        local_71 = false;
        if (bVar1) {
          local_71 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::IsInt(this_01);
        }
        if (local_71 == false) {
          __assert_fail("nameval.IsString() && typeval.IsInt()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x607,
                        "FSerializer &Serialize(FSerializer &, const char *, FTextureID &, FTextureID *)"
                       );
        }
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsString(this_00);
        if ((bVar1) &&
           (bVar1 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::IsInt(this_01), bVar1)) {
          cc = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_00);
          name_00 = UnicodeToString(cc);
          iVar4 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetInt(this_01);
          FVar3 = FTextureManager::GetTexture(&TexMan,name_00,iVar4,0);
          value->texnum = (int)FVar3;
        }
        else {
          Printf("\x1cGobject does not represent a texture for \'%s\'",key);
          FTextureID::SetNull(value);
          arc->mErrors = arc->mErrors + 1;
        }
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsNull(this);
        if (bVar1) {
          FTextureID::SetInvalid(value);
        }
        else {
          bVar1 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::IsInt(this);
          if ((!bVar1) ||
             (iVar4 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::GetInt(this), iVar4 != 0)) {
            __assert_fail("false && \"not a texture\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                          ,0x61d,
                          "FSerializer &Serialize(FSerializer &, const char *, FTextureID &, FTextureID *)"
                         );
          }
          FTextureID::SetNull(value);
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FTextureID &value, FTextureID *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			if (!value.Exists())
			{
				arc.WriteKey(key);
				arc.w->Null();
				return arc;
			}
			if (value.isNull())
			{
				// save 'no texture' in a more space saving way
				arc.WriteKey(key);
				arc.w->Int(0);
				return arc;
			}
			FTextureID chk = value;
			if (chk.GetIndex() >= TexMan.NumTextures()) chk.SetNull();
			FTexture *pic = TexMan[chk];
			const char *name;

			if (Wads.GetLinkedTexture(pic->SourceLump) == pic)
			{
				name = Wads.GetLumpFullName(pic->SourceLump);
			}
			else
			{
				name = pic->Name;
			}
			arc.WriteKey(key);
			arc.w->StartArray();
			arc.w->String(name);
			arc.w->Int(pic->UseType);
			arc.w->EndArray();
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsArray())
			{
				const rapidjson::Value &nameval = (*val)[0];
				const rapidjson::Value &typeval = (*val)[1];
				assert(nameval.IsString() && typeval.IsInt());
				if (nameval.IsString() && typeval.IsInt())
				{
					value = TexMan.GetTexture(UnicodeToString(nameval.GetString()), typeval.GetInt());
				}
				else
				{
					Printf(TEXTCOLOR_RED "object does not represent a texture for '%s'", key);
					value.SetNull();
					arc.mErrors++;
				}
			}
			else if (val->IsNull())
			{
				value.SetInvalid();
			}
			else if (val->IsInt() && val->GetInt() == 0)
			{
				value.SetNull();
			}
			else
			{
				assert(false && "not a texture");
				Printf(TEXTCOLOR_RED "object does not represent a texture for '%s'", key);
				value.SetNull();
				arc.mErrors++;
			}
		}
	}
	return arc;
}